

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O3

void gen_stfqu(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *pTVar1;
  uint uVar2;
  TCGTemp *a1;
  TCGv_i64 val;
  TCGTemp *a2;
  TCGTemp *pTVar3;
  uintptr_t o_1;
  TCGv_i64 pTVar4;
  TCGv_i64 pTVar5;
  uintptr_t o_4;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_3;
  TCGOpcode opc;
  uintptr_t o_6;
  uintptr_t o;
  TCGv_i64 ret;
  uint uVar6;
  uint uVar7;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar6 = ctx->opcode;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x30
                     );
    ctx->access_type = 0x30;
  }
  a1 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  val = (TCGv_i64)((long)a1 - (long)tcg_ctx_00);
  a2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a2 - (long)tcg_ctx_00);
  pTVar1 = ctx->uc->tcg_ctx;
  uVar7 = ctx->opcode;
  pTVar4 = (TCGv_i64)(long)(short)uVar7;
  uVar2 = uVar7 >> 0x10 & 0x1f;
  if (uVar2 == 0) {
    pTVar5 = (TCGv_i64)((ulong)pTVar4 & 0xffffffff);
    if (ctx->sf_mode != false) {
      pTVar5 = pTVar4;
    }
    opc = INDEX_op_movi_i64;
LAB_00b8b614:
    tcg_gen_op2_ppc64(pTVar1,opc,(TCGArg)(ret + (long)pTVar1),(TCGArg)pTVar5);
  }
  else {
    if ((uVar7 & 0xffff) == 0) {
      pTVar5 = cpu_gpr[uVar2];
      if (ctx->sf_mode != false) {
        if (pTVar5 == ret) goto LAB_00b8b619;
        pTVar5 = pTVar5 + (long)pTVar1;
        opc = INDEX_op_mov_i64;
        goto LAB_00b8b614;
      }
    }
    else {
      tcg_gen_addi_i64_ppc64(pTVar1,ret,cpu_gpr[uVar2],(int64_t)pTVar4);
      pTVar5 = ret;
      if (ctx->sf_mode != false) goto LAB_00b8b619;
    }
    tcg_gen_ext32u_i64_ppc64(pTVar1,ret,pTVar5);
  }
LAB_00b8b619:
  uVar7 = uVar6 >> 0x10 & 0x1f;
  uVar6 = uVar6 >> 0x11;
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_ld_i64,(TCGArg)a1,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)(uVar6 & 0x1f0) + 0x12b28);
  tcg_gen_qemu_st_i64_ppc64
            (ctx->uc->tcg_ctx,val,ret,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_64);
  pTVar3 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  pTVar4 = (TCGv_i64)((long)pTVar3 - (long)tcg_ctx_00);
  pTVar1 = ctx->uc->tcg_ctx;
  tcg_gen_addi_i64_ppc64(pTVar1,pTVar4,ret,8);
  if (ctx->sf_mode == false) {
    tcg_gen_ext32u_i64_ppc64(pTVar1,pTVar4,pTVar4);
  }
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_ld_i64,(TCGArg)a1,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)((uVar6 + 0x10 & 0x1f0) + 0x12b28));
  tcg_gen_qemu_st_i64_ppc64
            (ctx->uc->tcg_ctx,val,pTVar4,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_64);
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(pTVar4 + (long)tcg_ctx_00));
  if ((uVar7 != 0) && (cpu_gpr[uVar7] != ret)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(cpu_gpr[uVar7] + (long)tcg_ctx_00),
                      (TCGArg)a2);
  }
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(val + (long)tcg_ctx_00));
  return;
}

Assistant:

static void gen_stfqu(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int ra = rA(ctx->opcode);
    int rd = rD(ctx->opcode);
    TCGv t0, t1;
    TCGv_i64 t2;
    gen_set_access_type(ctx, ACCESS_FLOAT);
    t2 = tcg_temp_new_i64(tcg_ctx);
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_imm_index(ctx, t0, 0);
    get_fpr(tcg_ctx, t2, rd);
    gen_qemu_st64_i64(ctx, t2, t0);
    t1 = tcg_temp_new(tcg_ctx);
    gen_addr_add(ctx, t1, t0, 8);
    get_fpr(tcg_ctx, t2, (rd + 1) % 32);
    gen_qemu_st64_i64(ctx, t2, t1);
    tcg_temp_free(tcg_ctx, t1);
    if (ra != 0) {
        tcg_gen_mov_tl(tcg_ctx, cpu_gpr[ra], t0);
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t2);
}